

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

PropertyId __thiscall
IRBuilderAsmJs::CalculatePropertyOffset(IRBuilderAsmJs *this,RegSlot regSlot,IRType type)

{
  Types type_00;
  uint32 uVar1;
  undefined7 in_register_00000011;
  undefined1 local_44 [8];
  TypedSlotInfo typedInfo;
  
  type_00 = WAsmJs::FromIRType(type);
  AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)local_44,this->m_asmFuncInfo,type_00);
  uVar1 = GetTypedRegFromRegSlot(this,regSlot,type_00);
  return uVar1 * TySize[CONCAT71(in_register_00000011,type) & 0xffffffff] + typedInfo.varCount +
         0x160;
}

Assistant:

Js::PropertyId IRBuilderAsmJs::CalculatePropertyOffset(Js::RegSlot regSlot, IRType type)
{
    // Compute the offset to the start of the interpreter frame's locals array as a Var index.
    size_t localsOffset = Js::InterpreterStackFrame::GetOffsetOfLocals();
    Assert(localsOffset % sizeof(AsmJsSIMDValue) == 0);
    WAsmJs::Types asmType = WAsmJs::FromIRType(type);
    const auto typedInfo = m_asmFuncInfo->GetTypedSlotInfo(asmType);
    uint32 bytecodeRegSlot = GetTypedRegFromRegSlot(regSlot, asmType);
    return (Js::PropertyId)(bytecodeRegSlot * TySize[type] + typedInfo.byteOffset + localsOffset);
}